

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

void __thiscall
amrex::DistributionMapping::RoundRobinProcessorMap
          (DistributionMapping *this,vector<long,_std::allocator<long>_> *wgts,int nprocs,bool sort)

{
  size_type sVar1;
  const_reference __x;
  byte in_CL;
  vector<long,_std::allocator<long>_> *in_RSI;
  Ref *in_RDI;
  int i;
  int N;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> LIpairV;
  undefined1 in_stack_000005bf;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *in_stack_000005c0;
  int in_stack_000005c8;
  int in_stack_000005cc;
  DistributionMapping *in_stack_000005d0;
  value_type *in_stack_ffffffffffffff88;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *this_00;
  size_type in_stack_ffffffffffffffa8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffbc;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *in_stack_ffffffffffffffc0;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> local_30;
  byte local_15;
  vector<long,_std::allocator<long>_> *local_10;
  
  local_15 = in_CL & 1;
  local_10 = in_RSI;
  std::
  __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0xf55379);
  Ref::clear(in_RDI);
  std::
  __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0xf5538b);
  std::vector<long,_std::allocator<long>_>::size(local_10);
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = &local_30;
  std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::vector
            ((vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)0xf553b6);
  sVar1 = std::vector<long,_std::allocator<long>_>::size(local_10);
  std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::reserve
            (in_stack_ffffffffffffffc0,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
            );
  for (iVar2 = 0; iVar2 < (int)sVar1; iVar2 = iVar2 + 1) {
    __x = std::vector<long,_std::allocator<long>_>::operator[](local_10,(long)iVar2);
    std::pair<long,_int>::pair<int_&,_true>
              ((pair<long,_int> *)&stack0xffffffffffffffa8,__x,(int *)&stack0xffffffffffffffb8);
    std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::push_back
              ((vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)in_RDI,
               in_stack_ffffffffffffff88);
  }
  Sort(in_stack_ffffffffffffffc0,SUB41((uint)in_stack_ffffffffffffffbc >> 0x18,0));
  std::vector<long,_std::allocator<long>_>::size(local_10);
  RoundRobinDoIt(in_stack_000005d0,in_stack_000005cc,in_stack_000005c8,in_stack_000005c0,
                 (bool)in_stack_000005bf);
  std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::~vector(this_00);
  return;
}

Assistant:

void
DistributionMapping::RoundRobinProcessorMap (const std::vector<Long>& wgts,
                                             int nprocs, bool sort)
{
    BL_ASSERT(wgts.size() > 0);

    m_ref->clear();
    m_ref->m_pmap.resize(wgts.size());

    //
    // Create ordering of boxes from "heaviest" to "lightest".
    // When we round-robin the boxes we want to go from heaviest
    // to lightest box, starting from the CPU having the least
    // amount of FAB data to the one having the most.  This "should"
    // help even out the FAB data distribution when running on large
    // numbers of CPUs, where the lower levels of the calculation are
    // using RoundRobin to lay out fewer than NProc boxes across
    // the CPUs.
    //
    std::vector<LIpair> LIpairV;

    const int N = wgts.size();

    LIpairV.reserve(N);

    for (int i = 0; i < N; ++i)
    {
        LIpairV.push_back(LIpair(wgts[i],i));
    }

    Sort(LIpairV, true);

    RoundRobinDoIt(wgts.size(), nprocs, &LIpairV, sort);
}